

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void lzma_next_end(lzma_next_coder *next,lzma_allocator *allocator)

{
  if (next->init != 0) {
    if (next->end == (lzma_end_function)0x0) {
      lzma_free(next->coder,allocator);
    }
    else {
      (*next->end)(next->coder,allocator);
    }
    next->memconfig = (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    next->update = (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr
                    *)0x0;
    next->end = (lzma_end_function)0x0;
    next->get_check = (_func_lzma_check_lzma_coder_ptr *)0x0;
    next->init = 0;
    next->code = (lzma_code_function)0x0;
    next->coder = (lzma_coder *)0x0;
    next->id = 0xffffffffffffffff;
  }
  return;
}

Assistant:

extern void
lzma_next_end(lzma_next_coder *next, lzma_allocator *allocator)
{
	if (next->init != (uintptr_t)(NULL)) {
		// To avoid tiny end functions that simply call
		// lzma_free(coder, allocator), we allow leaving next->end
		// NULL and call lzma_free() here.
		if (next->end != NULL)
			next->end(next->coder, allocator);
		else
			lzma_free(next->coder, allocator);

		// Reset the variables so the we don't accidentally think
		// that it is an already initialized coder.
		*next = LZMA_NEXT_CODER_INIT;
	}

	return;
}